

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::ReadV1_TCODE_RHINOIO_OBJECT_NURBS_CURVE
          (ON_BinaryArchive *this,ON_Object **ppObject,ON_3dmObjectAttributes *pAttributes)

{
  ulong in_RAX;
  ON_NurbsCurve *pOVar1;
  bool bHaveMat;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  pOVar1 = ReadV1_RHINOIO_NURBS_CURVE_OBJECT_DATA(this);
  if (pOVar1 != (ON_NurbsCurve *)0x0) {
    *ppObject = (ON_Object *)pOVar1;
    Read3dmV1AttributesOrMaterial
              (this,pAttributes,(ON_Material *)0x0,(bool *)((long)&uStack_28 + 7),0x2ffff,
               (ON__3dmV1_XDATA *)0x0);
  }
  return pOVar1 != (ON_NurbsCurve *)0x0;
}

Assistant:

bool ON_BinaryArchive::ReadV1_TCODE_RHINOIO_OBJECT_NURBS_CURVE(
  ON_Object** ppObject,
  ON_3dmObjectAttributes* pAttributes
  )
{
  // read contents of ReadV1_TCODE_RHINOIO_OBJECT_NURBS_CURVE chunk
  // written by v1 RhinoIO toolkit
  ON_NurbsCurve* curve = 0;
  bool rc = false;
  bool bHaveMat = false;
  
  // reads TCODE_RHINOIO_OBJECT_DATA header and nurbs curve definition
  curve = ReadV1_RHINOIO_NURBS_CURVE_OBJECT_DATA(*this);

  if ( curve ) {
    *ppObject = curve;
    rc = true;
    Read3dmV1AttributesOrMaterial(pAttributes,nullptr,bHaveMat,TCODE_RHINOIO_OBJECT_END);
  }

  return rc;
}